

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

BOOL is_word_char(uint32_t c)

{
  return (BOOL)((c == 0x5f || c - 0x30 < 10) || (c & 0xffffffdf) - 0x41 < 0x1a);
}

Assistant:

static BOOL is_word_char(uint32_t c)
{
    return ((c >= '0' && c <= '9') ||
            (c >= 'a' && c <= 'z') ||
            (c >= 'A' && c <= 'Z') ||
            (c == '_'));
}